

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibString.cpp
# Opt level: O1

int lib::string::Sub(State *state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  String *pSVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  double dVar10;
  StackAPI api;
  string sub;
  StackAPI local_60;
  string local_50;
  
  luna::StackAPI::StackAPI(&local_60,state);
  bVar3 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT,luna::ValueT>
                    (&local_60,2,ValueT_String,ValueT_Number,ValueT_Number);
  iVar4 = 0;
  if (bVar3) {
    pSVar6 = luna::StackAPI::GetString(&local_60,0);
    uVar2 = pSVar6->length_;
    dVar10 = luna::StackAPI::GetNumber(&local_60,1);
    iVar8 = (int)dVar10;
    iVar4 = luna::StackAPI::GetStackSize(&local_60);
    uVar9 = uVar2;
    if (iVar4 < 3) {
      iVar7 = 1;
      if ((iVar8 != 0) && (iVar7 = iVar8, iVar8 < 0)) {
        iVar7 = 1;
        if (-1 < (int)(uVar2 + iVar8)) {
          iVar7 = uVar2 + 1 + iVar8;
        }
      }
    }
    else {
      iVar4 = -iVar8;
      if (0 < iVar8) {
        iVar4 = iVar8;
      }
      iVar7 = 1;
      if (iVar8 != 0) {
        iVar7 = iVar4;
      }
      dVar10 = luna::StackAPI::GetNumber(&local_60,2);
      uVar5 = (uint)dVar10;
      uVar9 = -uVar5;
      if (0 < (int)uVar5) {
        uVar9 = uVar5;
      }
      if ((int)uVar2 < (int)uVar9) {
        uVar9 = uVar2;
      }
    }
    paVar1 = &local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    if (iVar7 <= (int)uVar9) {
      iVar4 = -1;
      do {
        std::__cxx11::string::push_back((char)&local_50);
        iVar4 = iVar4 + 1;
      } while (uVar9 - iVar7 != iVar4);
    }
    luna::StackAPI::PushString(&local_60,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Sub(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(2, luna::ValueT_String,
                           luna::ValueT_Number, luna::ValueT_Number))
            return 0;

        auto str = api.GetString(0);
        int size = str->GetLength();
        auto c_str = str->GetCStr();
        auto start = static_cast<int>(api.GetNumber(1));
        auto end = size;

        auto params = api.GetStackSize();
        if (params <= 2)
        {
            if (start == 0)
            {
                start = 1;
            }
            else if (start < 0)
            {
                start += size;
                start = start < 0 ? 1 : start + 1;
            }
        }
        else
        {
            start = start == 0 ? 1 : std::abs(start);
            end = std::abs(static_cast<int>(api.GetNumber(2)));
            end = std::min(end, size);
        }

        std::string sub;
        for (int i = start; i <= end; ++i)
            sub.push_back(c_str[i - 1]);

        api.PushString(sub);
        return 1;
    }